

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTabBar::child(QAccessibleTabBar *this,int index)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  QTabBarPrivate *pQVar5;
  int in_ESI;
  long in_FS_OFFSET;
  QAccessibleTabButton *button;
  Id id;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QAccessibleTabButton *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QHash<int,_unsigned_int>::value
                    ((QHash<int,_unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (uVar2 == 0) {
    tabBar((QAccessibleTabBar *)0x7d4537);
    iVar3 = QTabBar::count((QTabBar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    if (in_ESI < iVar3) {
      local_18 = (QAccessibleTabButton *)operator_new(0x28);
      tabBar((QAccessibleTabBar *)0x7d4566);
      QAccessibleTabButton::QAccessibleTabButton
                (local_18,(QTabBar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff94);
      QAccessible::registerAccessibleInterface((QAccessibleInterface *)local_18);
      QAccessible::uniqueId((QAccessibleInterface *)local_18);
      QHash<int,_unsigned_int>::insert
                ((QHash<int,_unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,(uint *)0x7d45bb);
    }
    else {
      iVar3 = in_ESI;
      tabBar((QAccessibleTabBar *)0x7d45e6);
      iVar4 = QTabBar::count((QTabBar *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar4 <= iVar3) {
        iVar3 = in_ESI;
        tabBar((QAccessibleTabBar *)0x7d460e);
        iVar4 = QTabBar::count((QTabBar *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (iVar3 == iVar4) {
          tabBar((QAccessibleTabBar *)0x7d462d);
          pQVar5 = QTabBar::d_func((QTabBar *)0x7d4635);
          local_18 = (QAccessibleTabButton *)
                     QAccessible::queryAccessibleInterface((QObject *)pQVar5->leftB);
          goto LAB_007d46a1;
        }
        tabBar((QAccessibleTabBar *)0x7d465a);
        iVar3 = QTabBar::count((QTabBar *)CONCAT44(in_ESI,in_stack_ffffffffffffff90));
        if (in_ESI - iVar3 == 1) {
          tabBar((QAccessibleTabBar *)0x7d4679);
          pQVar5 = QTabBar::d_func((QTabBar *)0x7d4681);
          local_18 = (QAccessibleTabButton *)
                     QAccessible::queryAccessibleInterface((QObject *)pQVar5->rightB);
          goto LAB_007d46a1;
        }
      }
      local_18 = (QAccessibleTabButton *)0x0;
    }
  }
  else {
    local_18 = (QAccessibleTabButton *)QAccessible::accessibleInterface(uVar2);
  }
LAB_007d46a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return &local_18->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface* QAccessibleTabBar::child(int index) const
{
    if (QAccessible::Id id = m_childInterfaces.value(index))
        return QAccessible::accessibleInterface(id);

    // first the tabs, then 2 buttons
    if (index < tabBar()->count()) {
        QAccessibleTabButton *button = new QAccessibleTabButton(tabBar(), index);
        QAccessible::registerAccessibleInterface(button);
        m_childInterfaces.insert(index, QAccessible::uniqueId(button));
        return button;
    } else if (index >= tabBar()->count()) {
        // left button
        if (index - tabBar()->count() == 0) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->leftB);
        }
        // right button
        if (index - tabBar()->count() == 1) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->rightB);
        }
    }
    return nullptr;
}